

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkClearance.cpp
# Opt level: O1

void __thiscall chrono::ChLinkClearance::ArchiveIN(ChLinkClearance *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChLinkClearance>(marchive);
  ChLinkLockLock::ArchiveIN(&this->super_ChLinkLockLock,marchive);
  local_30 = &this->clearance;
  local_38 = "clearance";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->c_friction;
  local_38 = "c_friction";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->c_restitution;
  local_38 = "c_restitution";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->diameter;
  local_38 = "diameter";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->c_tang_restitution;
  local_38 = "c_tang_restitution";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->c_viscous;
  local_38 = "c_viscous";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChLinkClearance::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkClearance>();

    // deserialize parent class
    ChLinkLockLock::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(clearance);
    marchive >> CHNVP(c_friction);
    marchive >> CHNVP(c_restitution);
    marchive >> CHNVP(diameter);
    marchive >> CHNVP(c_tang_restitution);
    marchive >> CHNVP(c_viscous);
}